

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.c
# Opt level: O2

stumpless_element * stumpless_new_element(char *name)

{
  _Bool _Var1;
  size_t in_RAX;
  stumpless_element *element;
  stumpless_element *psVar2;
  size_t name_length;
  
  if (name == (char *)0x0) {
    raise_argument_empty("name was NULL");
  }
  else {
    name_length = in_RAX;
    _Var1 = validate_element_name(name,&name_length);
    if ((_Var1) &&
       (element = (stumpless_element *)alloc_mem(0x48), element != (stumpless_element *)0x0)) {
      clear_error();
      psVar2 = unchecked_load_element(element,name,name_length);
      if (psVar2 != (stumpless_element *)0x0) {
        return psVar2;
      }
      free_mem(element);
    }
  }
  return (stumpless_element *)0x0;
}

Assistant:

struct stumpless_element *
stumpless_new_element( const char *name ) {
  size_t name_length;
  struct stumpless_element *element;
  struct stumpless_element *result;

  VALIDATE_ARG_NOT_NULL( name );

  if( unlikely( !validate_element_name( name, &name_length ) ) ) {
    return NULL;
  }

  element = alloc_mem( sizeof( *element ) );
  if( unlikely( !element ) ) {
    return NULL;
  }

  clear_error(  );

  result = unchecked_load_element( element, name, name_length );
  if( !result ) {
    free_mem( element );
  }

  return result;
}